

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O0

void Gia_ManAreRebalance(Gia_ManAre_t *p,Gia_PtrAre_t *pRoot)

{
  uint uVar1;
  int iVar2;
  Gia_PtrAre_t GVar3;
  Gia_ObjAre_t *pGVar4;
  Gia_ObjAre_t *pGVar5;
  Gia_PtrAre_t local_30;
  Gia_PtrAre_t local_2c;
  Gia_PtrAre_t iNext;
  Gia_PtrAre_t iCube;
  Gia_StaAre_t *pCube;
  Gia_ObjAre_t *pNode;
  Gia_PtrAre_t *pRoot_local;
  Gia_ManAre_t *p_local;
  
  if ((((uint)*pRoot & 0xfffff) == 0) && (((uint)*pRoot >> 0x14 & 0x7ff) == 0)) {
    __assert_fail("pRoot->nItem || pRoot->nPage",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEra2.c"
                  ,0x38c,"void Gia_ManAreRebalance(Gia_ManAre_t *, Gia_PtrAre_t *)");
  }
  pGVar4 = Gia_ManAreCreateObj(p);
  uVar1 = Gia_ManAreFindBestVar(p,*pRoot);
  *(uint *)pGVar4 = *(uint *)pGVar4 & 0xffffc000 | uVar1 & 0x3fff;
  local_2c = *pRoot;
  _iNext = Gia_ManAreSta(p,local_2c);
  local_30 = _iNext->iNext;
  while (iVar2 = Gia_StaIsGood(p,_iNext), iVar2 != 0) {
    iVar2 = Gia_StaIsUnused(_iNext);
    if (iVar2 == 0) {
      iVar2 = Gia_StaHasValue0(_iNext,*(uint *)pGVar4 & 0x3fff);
      if (iVar2 == 0) {
        iVar2 = Gia_StaHasValue1(_iNext,*(uint *)pGVar4 & 0x3fff);
        if (iVar2 == 0) {
          _iNext->iNext = pGVar4->F[2];
          pGVar4->F[2] = local_2c;
          *(uint *)pGVar4 =
               *(uint *)pGVar4 & 0x3ffffff | ((*(uint *)pGVar4 >> 0x1a) + 1) * 0x4000000;
        }
        else {
          _iNext->iNext = pGVar4->F[1];
          pGVar4->F[1] = local_2c;
          *(uint *)pGVar4 =
               *(uint *)pGVar4 & 0xfc0fffff | ((*(uint *)pGVar4 >> 0x14 & 0x3f) + 1 & 0x3f) << 0x14;
        }
      }
      else {
        _iNext->iNext = pGVar4->F[0];
        pGVar4->F[0] = local_2c;
        *(uint *)pGVar4 =
             *(uint *)pGVar4 & 0xfff03fff | ((*(uint *)pGVar4 >> 0xe & 0x3f) + 1 & 0x3f) << 0xe;
      }
    }
    local_2c = local_30;
    _iNext = Gia_ManAreSta(p,local_30);
    local_30 = _iNext->iNext;
  }
  GVar3 = Gia_Int2Ptr(p->nObjs - 1);
  *pRoot = GVar3;
  pGVar5 = Gia_ManAreObj(p,*pRoot);
  if (pGVar4 != pGVar5) {
    __assert_fail("pNode == Gia_ManAreObj(p, *pRoot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEra2.c"
                  ,0x39d,"void Gia_ManAreRebalance(Gia_ManAre_t *, Gia_PtrAre_t *)");
  }
  p->fTree = 1;
  return;
}

Assistant:

static inline void Gia_ManAreRebalance( Gia_ManAre_t * p, Gia_PtrAre_t * pRoot )
{
    Gia_ObjAre_t * pNode;
    Gia_StaAre_t * pCube;
    Gia_PtrAre_t iCube, iNext;
    assert( pRoot->nItem || pRoot->nPage );
    pNode = Gia_ManAreCreateObj( p );
    pNode->iVar = Gia_ManAreFindBestVar( p, *pRoot );
    for ( iCube = *pRoot, pCube = Gia_ManAreSta(p, iCube), iNext = pCube->iNext; 
          Gia_StaIsGood(p, pCube); 
          iCube = iNext,  pCube = Gia_ManAreSta(p, iCube), iNext = pCube->iNext )
    {
        if ( Gia_StaIsUnused(pCube) )
            continue;
        if ( Gia_StaHasValue0(pCube, pNode->iVar) )
            pCube->iNext = pNode->F[0], pNode->F[0] = iCube, pNode->nStas0++;
        else if ( Gia_StaHasValue1(pCube, pNode->iVar) )
            pCube->iNext = pNode->F[1], pNode->F[1] = iCube, pNode->nStas1++;
        else
            pCube->iNext = pNode->F[2], pNode->F[2] = iCube, pNode->nStas2++;
    }
    *pRoot = Gia_Int2Ptr(p->nObjs - 1);
    assert( pNode == Gia_ManAreObj(p, *pRoot) );
    p->fTree = 1;
}